

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-equal.c
# Opt level: O3

int run_test_thread_equal(void)

{
  int *piVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_thread_t uVar3;
  undefined4 *puVar4;
  pthread_t __th;
  ulong uVar5;
  undefined8 extraout_RDX;
  uv_thread_t *unaff_RBX;
  code *pcVar6;
  uv_key_t *puVar7;
  int iVar8;
  uv_thread_t *puVar9;
  uv_thread_t *puVar10;
  uv_thread_t *puVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  uv_key_t *puVar14;
  code **ppcVar15;
  code **ppcVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  long lVar29;
  long lVar30;
  undefined4 *puVar31;
  uv_thread_t threads [2];
  undefined1 auStack_f28 [8];
  undefined4 auStack_f20 [2];
  code *pcStack_f18;
  rlimit64 rStack_f10;
  ulong uStack_f00;
  pthread_attr_t pStack_ef8;
  code *pcStack_ec0;
  code *apcStack_eb8 [2];
  code *pcStack_ea8;
  code *pcStack_ea0;
  undefined4 uStack_e90;
  undefined1 uStack_e8c;
  undefined1 auStack_e88 [8];
  undefined1 auStack_e80 [16];
  code *pcStack_e70;
  code *pcStack_e68;
  undefined4 auStack_e60 [212];
  getaddrinfo_req agStack_b10 [4];
  fs_req afStack_830 [4];
  code *pcStack_f0;
  long lStack_e8;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  uv_thread_t *puStack_50;
  undefined8 auStack_38 [2];
  undefined8 uStack_28;
  code *pcStack_20;
  uv_thread_t uStack_18;
  uv_thread_t local_10;
  
  puVar10 = &uStack_18;
  puVar11 = &uStack_18;
  pcStack_20 = (code *)0x175432;
  main_thread_id = uv_thread_self();
  puVar9 = &main_thread_id;
  pcStack_20 = (code *)0x175448;
  iVar2 = uv_thread_equal(&main_thread_id,&main_thread_id);
  if (iVar2 == 0) {
    pcStack_20 = (code *)0x1754c1;
    run_test_thread_equal_cold_6();
LAB_001754c1:
    pcStack_20 = (code *)0x1754c6;
    run_test_thread_equal_cold_1();
LAB_001754c6:
    puVar11 = puVar9;
    pcStack_20 = (code *)0x1754cb;
    run_test_thread_equal_cold_2();
LAB_001754cb:
    pcStack_20 = (code *)0x1754d0;
    run_test_thread_equal_cold_3();
LAB_001754d0:
    pcStack_20 = (code *)0x1754d5;
    run_test_thread_equal_cold_4();
  }
  else {
    pcStack_20 = (code *)0x175462;
    iVar2 = uv_thread_create(&uStack_18,check_thread,subthreads);
    puVar9 = puVar10;
    if (iVar2 != 0) goto LAB_001754c1;
    unaff_RBX = &local_10;
    pcStack_20 = (code *)0x175481;
    puVar9 = unaff_RBX;
    iVar2 = uv_thread_create(unaff_RBX,check_thread,0x506758);
    if (iVar2 != 0) goto LAB_001754c6;
    pcStack_20 = (code *)0x17548d;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_001754cb;
    pcStack_20 = (code *)0x175499;
    puVar11 = unaff_RBX;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_001754d0;
    puVar11 = subthreads;
    pcStack_20 = (code *)0x1754b0;
    iVar2 = uv_thread_equal(subthreads,0x506758);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_20 = check_thread;
  run_test_thread_equal_cold_5();
  auStack_38[0] = 0x1754e7;
  pcStack_20 = (code *)unaff_RBX;
  uStack_28 = uv_thread_self();
  auStack_38[0] = 0x1754fb;
  iVar2 = uv_thread_equal(&main_thread_id);
  if (iVar2 == 0) {
    auStack_38[0] = 0x175504;
    uVar3 = uv_thread_self();
    *puVar11 = uVar3;
    return (int)uVar3;
  }
  auStack_38[0] = 0x175512;
  check_thread_cold_1();
  puVar12 = auStack_38;
  puVar13 = auStack_38;
  iVar2 = uv_thread_create(auStack_38,thread_entry,0x2a);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_0017554b;
    if (thread_called == 1) {
      return 0;
    }
  }
  else {
    run_test_thread_create_cold_1();
    puVar13 = puVar12;
LAB_0017554b:
    run_test_thread_create_cold_2();
  }
  run_test_thread_create_cold_3();
  if (puVar13 == (undefined8 *)0x2a) {
    thread_called = thread_called + 1;
    return extraout_EAX;
  }
  thread_entry_cold_1();
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  lVar30 = 0;
  pcVar6 = do_work;
  puStack_50 = puVar11;
  do {
    puVar7 = (uv_key_t *)((long)&uStack_d8 + lVar30);
    iVar2 = uv_thread_create(puVar7,do_work,puVar7);
    if (iVar2 != 0) {
      run_test_threadpool_multiple_event_loops_cold_1();
      goto LAB_001755fb;
    }
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x80);
  pcVar6 = (code *)0x0;
  while( true ) {
    puVar7 = (uv_key_t *)((long)&uStack_d8 + (long)pcVar6);
    iVar2 = uv_thread_join();
    if (iVar2 != 0) break;
    if (*(int *)((long)&uStack_d0 + (long)pcVar6) != 1) goto LAB_001755fb;
    pcVar6 = pcVar6 + 0x10;
    if (pcVar6 == (code *)0x80) {
      return 0;
    }
  }
  goto LAB_00175600;
LAB_001755fb:
  run_test_threadpool_multiple_event_loops_cold_3();
LAB_00175600:
  run_test_threadpool_multiple_event_loops_cold_2();
  puVar31 = auStack_e60;
  pcStack_e68 = (code *)0x17561f;
  pcStack_f0 = pcVar6;
  lStack_e8 = lVar30;
  iVar2 = uv_loop_init(auStack_e60);
  if (iVar2 == 0) {
    lVar30 = 0;
    do {
      *(undefined4 *)((long)agStack_b10[0].handle.reserved + lVar30 + -0x20) = 4;
      *(undefined4 **)((long)agStack_b10[0].handle.reserved + lVar30 + -0x18) = auStack_e60;
      pcStack_e68 = (code *)0x175645;
      getaddrinfo_do((getaddrinfo_req *)((long)agStack_b10[0].handle.reserved + lVar30 + -0x28));
      lVar30 = lVar30 + 0xb8;
    } while (lVar30 != 0x2e0);
    lVar30 = 0;
    do {
      *(undefined4 *)((long)afStack_830[0].handle.reserved + lVar30 + -0x20) = 4;
      *(undefined4 **)((long)afStack_830[0].handle.reserved + lVar30 + -0x18) = auStack_e60;
      pcStack_e68 = (code *)0x175673;
      fs_do((fs_req *)((long)afStack_830[0].handle.reserved + lVar30 + -0x28));
      lVar30 = lVar30 + 0x1d0;
    } while (lVar30 != 0x740);
    pcStack_e68 = (code *)0x17568d;
    iVar2 = uv_run(auStack_e60,0);
    if (iVar2 != 0) goto LAB_001756b6;
    pcStack_e68 = (code *)0x175699;
    iVar2 = uv_loop_close(auStack_e60);
    if (iVar2 == 0) {
      *(undefined4 *)((long)puVar7 + 8) = 1;
      return 0;
    }
  }
  else {
    pcStack_e68 = (code *)0x1756b6;
    do_work_cold_1();
LAB_001756b6:
    pcStack_e68 = (code *)0x1756bb;
    do_work_cold_2();
  }
  pcStack_e68 = run_test_thread_local_storage;
  do_work_cold_3();
  uStack_e8c = 0;
  uStack_e90 = 0x6e69616d;
  puVar14 = &tls_key;
  pcStack_ea0 = (code *)0x1756e0;
  pcStack_e70 = (code *)puVar7;
  pcStack_e68 = (code *)auStack_e60;
  iVar2 = uv_key_create();
  if (iVar2 == 0) {
    puVar14 = &tls_key;
    pcStack_ea0 = (code *)0x1756f4;
    lVar30 = uv_key_get();
    if (lVar30 != 0) goto LAB_00175789;
    puVar7 = &tls_key;
    puVar31 = &uStack_e90;
    pcStack_ea0 = (code *)0x175714;
    uv_key_set(&tls_key,puVar31);
    puVar14 = &tls_key;
    pcStack_ea0 = (code *)0x17571c;
    puVar4 = (undefined4 *)uv_key_get();
    if (puVar31 != puVar4) goto LAB_0017578e;
    puVar14 = (uv_key_t *)auStack_e88;
    pcStack_ea0 = (code *)0x175735;
    iVar2 = uv_thread_create(puVar14,tls_thread,puVar14);
    if (iVar2 != 0) goto LAB_00175793;
    puVar7 = (uv_key_t *)auStack_e80;
    pcStack_ea0 = (code *)0x175750;
    puVar14 = puVar7;
    iVar2 = uv_thread_create(puVar7,tls_thread,puVar7);
    if (iVar2 != 0) goto LAB_00175798;
    puVar14 = (uv_key_t *)auStack_e88;
    pcStack_ea0 = (code *)0x17575e;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_0017579d;
    pcStack_ea0 = (code *)0x17576a;
    puVar14 = puVar7;
    iVar2 = uv_thread_join();
    if (iVar2 == 0) {
      pcStack_ea0 = (code *)0x17577a;
      uv_key_delete(&tls_key);
      return 0;
    }
  }
  else {
    pcStack_ea0 = (code *)0x175789;
    run_test_thread_local_storage_cold_1();
LAB_00175789:
    pcStack_ea0 = (code *)0x17578e;
    run_test_thread_local_storage_cold_2();
LAB_0017578e:
    pcStack_ea0 = (code *)0x175793;
    run_test_thread_local_storage_cold_3();
LAB_00175793:
    pcStack_ea0 = (code *)0x175798;
    run_test_thread_local_storage_cold_4();
LAB_00175798:
    pcStack_ea0 = (code *)0x17579d;
    run_test_thread_local_storage_cold_5();
LAB_0017579d:
    pcStack_ea0 = (code *)0x1757a2;
    run_test_thread_local_storage_cold_6();
  }
  pcStack_ea0 = tls_thread;
  run_test_thread_local_storage_cold_7();
  apcStack_eb8[0] = (code *)0x1757ba;
  pcStack_ea8 = (code *)puVar7;
  pcStack_ea0 = (code *)puVar31;
  lVar30 = uv_key_get(&tls_key);
  if (lVar30 == 0) {
    apcStack_eb8[0] = (code *)0x1757d1;
    uv_key_set(&tls_key,puVar14);
    apcStack_eb8[0] = (code *)0x1757d9;
    pcVar6 = (code *)uv_key_get(&tls_key);
    if (pcVar6 != (code *)puVar14) goto LAB_00175809;
    puVar14 = &tls_key;
    apcStack_eb8[0] = (code *)0x1757ef;
    uv_key_set(&tls_key,0);
    apcStack_eb8[0] = (code *)0x1757f7;
    lVar30 = uv_key_get(&tls_key);
    if (lVar30 == 0) {
      return 0;
    }
  }
  else {
    apcStack_eb8[0] = (code *)0x175809;
    tls_thread_cold_1();
LAB_00175809:
    apcStack_eb8[0] = (code *)0x17580e;
    tls_thread_cold_2();
  }
  apcStack_eb8[0] = run_test_thread_stack_size;
  tls_thread_cold_3();
  ppcVar15 = apcStack_eb8;
  ppcVar16 = apcStack_eb8;
  pcStack_ec0 = (code *)0x175825;
  iVar2 = uv_thread_create(apcStack_eb8,thread_check_stack,0);
  if (iVar2 == 0) {
    pcStack_ec0 = (code *)0x175831;
    iVar2 = uv_thread_join();
    ppcVar15 = ppcVar16;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_ec0 = (code *)0x17583e;
    run_test_thread_stack_size_cold_1();
  }
  pcStack_ec0 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  pcStack_f18 = (code *)0x175858;
  pcStack_ec0 = (code *)puVar14;
  iVar2 = getrlimit64(RLIMIT_STACK,&rStack_f10);
  if (iVar2 == 0) {
    if (rStack_f10.rlim_cur == 0xffffffffffffffff) {
      rStack_f10.rlim_cur = 0x200000;
    }
    pcStack_f18 = (code *)0x175870;
    __th = pthread_self();
    pcStack_f18 = (code *)0x17587d;
    iVar2 = pthread_getattr_np(__th,&pStack_ef8);
    if (iVar2 != 0) goto LAB_001758c6;
    pcStack_f18 = (code *)0x175890;
    iVar2 = pthread_attr_getstacksize(&pStack_ef8,&uStack_f00);
    if (iVar2 != 0) goto LAB_001758cb;
    if ((ppcVar15 == (code **)0x0) ||
       (uVar5 = *(ulong *)((long)ppcVar15 + 8), *(ulong *)((long)ppcVar15 + 8) == 0)) {
      uVar5 = rStack_f10.rlim_cur;
    }
    if (uStack_f00 < uVar5) goto LAB_001758d0;
    pcStack_f18 = (code *)0x1758b7;
    iVar2 = pthread_attr_destroy(&pStack_ef8);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_f18 = (code *)0x1758c6;
    thread_check_stack_cold_1();
LAB_001758c6:
    pcStack_f18 = (code *)0x1758cb;
    thread_check_stack_cold_2();
LAB_001758cb:
    pcStack_f18 = (code *)0x1758d0;
    thread_check_stack_cold_3();
LAB_001758d0:
    pcStack_f18 = (code *)0x1758d5;
    thread_check_stack_cold_5();
  }
  pcStack_f18 = run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  puVar17 = auStack_f28;
  puVar18 = auStack_f28;
  puVar19 = auStack_f28;
  puVar24 = auStack_f28;
  puVar20 = auStack_f28;
  puVar25 = auStack_f28;
  puVar21 = auStack_f28;
  puVar26 = auStack_f28;
  puVar22 = auStack_f28;
  puVar27 = auStack_f28;
  puVar23 = auStack_f28;
  puVar28 = auStack_f28;
  auStack_f20[0] = 1;
  pcStack_f18 = (code *)0x100000;
  iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join();
    puVar17 = puVar18;
    if (iVar2 != 0) goto LAB_00175a4b;
    pcStack_f18 = (code *)0x800000;
    iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
    puVar17 = puVar19;
    if (iVar2 != 0) goto LAB_00175a50;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175a55;
    pcStack_f18 = (code *)0x0;
    iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
    puVar24 = puVar20;
    if (iVar2 != 0) goto LAB_00175a5a;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175a5f;
    lVar30 = __sysconf(0x4b);
    pcStack_f18 = (code *)(lVar30 + -0x2a);
    iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
    puVar25 = puVar21;
    if (iVar2 != 0) goto LAB_00175a64;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175a69;
    lVar30 = __sysconf(0x4b);
    pcStack_f18 = (code *)(lVar30 / 2 + -0x2a);
    iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
    puVar26 = puVar22;
    if (iVar2 != 0) goto LAB_00175a6e;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175a73;
    pcStack_f18 = (code *)0x12d687;
    iVar2 = uv_thread_create_ex(auStack_f28,auStack_f20,thread_check_stack);
    puVar27 = puVar23;
    if (iVar2 == 0) {
      iVar2 = uv_thread_join();
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00175a7d;
    }
  }
  else {
    run_test_thread_stack_size_explicit_cold_1();
LAB_00175a4b:
    run_test_thread_stack_size_explicit_cold_2();
LAB_00175a50:
    puVar24 = puVar17;
    run_test_thread_stack_size_explicit_cold_3();
LAB_00175a55:
    run_test_thread_stack_size_explicit_cold_4();
LAB_00175a5a:
    puVar25 = puVar24;
    run_test_thread_stack_size_explicit_cold_5();
LAB_00175a5f:
    run_test_thread_stack_size_explicit_cold_6();
LAB_00175a64:
    puVar26 = puVar25;
    run_test_thread_stack_size_explicit_cold_7();
LAB_00175a69:
    run_test_thread_stack_size_explicit_cold_8();
LAB_00175a6e:
    puVar27 = puVar26;
    run_test_thread_stack_size_explicit_cold_9();
LAB_00175a73:
    run_test_thread_stack_size_explicit_cold_10();
  }
  puVar28 = puVar27;
  run_test_thread_stack_size_explicit_cold_11();
LAB_00175a7d:
  run_test_thread_stack_size_explicit_cold_12();
  lVar30 = *(long *)(puVar28 + 0x10);
  iVar2 = uv_getaddrinfo(lVar30,puVar28 + 0x18,getaddrinfo_cb,"localhost",0,0);
  if (iVar2 == 0) {
    return extraout_EAX_00;
  }
  getaddrinfo_do_cold_1();
  lVar29 = *(long *)(lVar30 + 0x10);
  lVar30 = lVar30 + 0x18;
  iVar2 = uv_fs_stat(lVar29,lVar30,".",fs_cb);
  iVar8 = (int)lVar30;
  if (iVar2 == 0) {
    return extraout_EAX_01;
  }
  fs_do_cold_1();
  if (iVar8 != 0) {
    getaddrinfo_cb_cold_1();
    iVar2 = uv_fs_req_cleanup();
    piVar1 = (int *)(lVar29 + -0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      fs_do((fs_req *)(lVar29 + -0x18));
      return extraout_EAX_03;
    }
    return iVar2;
  }
  iVar2 = uv_freeaddrinfo(extraout_RDX);
  piVar1 = (int *)(lVar29 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(lVar29 + -0x18));
    return extraout_EAX_02;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(thread_equal) {
  uv_thread_t threads[2];
  main_thread_id = uv_thread_self();
  ASSERT(0 != uv_thread_equal(&main_thread_id, &main_thread_id));
  ASSERT(0 == uv_thread_create(threads + 0, check_thread, subthreads + 0));
  ASSERT(0 == uv_thread_create(threads + 1, check_thread, subthreads + 1));
  ASSERT(0 == uv_thread_join(threads + 0));
  ASSERT(0 == uv_thread_join(threads + 1));
  ASSERT(0 == uv_thread_equal(subthreads + 0, subthreads + 1));
  return 0;
}